

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::TextbookBoyerMooreSetup<char16_t>::Init(TextbookBoyerMooreSetup<char16_t> *this)

{
  uint uVar1;
  Char *pCVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (this->patLen == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xc,"(patLen > 0)","patLen > 0");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  this->lastOcc[0] = -1;
  this->lastOcc[1] = -1;
  this->lastOcc[2] = -1;
  this->lastOcc[3] = -1;
  this->numLinearChars = 1;
  pCVar2 = this->pat;
  uVar1 = this->patLen;
  this->linearChar[0] = pCVar2[uVar1 - 1];
  if (uVar1 != 0) {
    uVar6 = this->numLinearChars;
    uVar7 = 0;
    do {
      if (uVar6 < 5) {
        if (uVar6 == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = 0;
          do {
            if (this->linearChar[uVar8] == pCVar2[uVar7]) {
              this->lastOcc[uVar8] = (int32)uVar7;
              goto LAB_00f19110;
            }
            uVar8 = uVar8 + 1;
          } while (uVar6 != (uint)uVar8);
          uVar8 = (ulong)uVar6;
        }
LAB_00f19110:
        if ((uint)uVar8 == uVar6) {
          if (uVar6 != 4) {
            this->linearChar[uVar6] = pCVar2[uVar7];
            this->lastOcc[uVar6] = (int32)uVar7;
          }
          uVar6 = uVar6 + 1;
          this->numLinearChars = uVar6;
        }
      }
    } while ((uVar6 < 5) && (uVar7 = uVar7 + 1, uVar7 != uVar1));
  }
  this->scheme = (uint)(this->numLinearChars < 5);
  return;
}

Assistant:

void TextbookBoyerMooreSetup<C>::Init()
    {
        Assert(patLen > 0);
        for (uint i = 0; i < MaxCharMapLinearChars; i++)
        {
            lastOcc[i] = -1;
        }

        numLinearChars = 1;

        // Always put the last character in the first index
        linearChar[0] = pat[patLen - 1];
        for (CharCount i = 0; i < patLen; i++)
        {
            if (numLinearChars <= MaxCharMapLinearChars)
            {
                uint j = 0;
                for (; j < numLinearChars; j++)
                {
                    if (linearChar[j] == pat[i])
                    {
                        lastOcc[j] = i;
                        break;
                    }
                }
                if (j == numLinearChars)
                {
                    if (numLinearChars < MaxCharMapLinearChars)
                    {
                        linearChar[numLinearChars] = pat[i];
                        lastOcc[numLinearChars] = i;
                    }
                    numLinearChars++;
                }
            }

            if (numLinearChars > MaxCharMapLinearChars)
            {
                break;
            }
        }
        if (numLinearChars <= MaxCharMapLinearChars)
        {
            scheme = LinearScheme;
        }
        else
        {
            scheme = DefaultScheme;
        }
    }